

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

bool __thiscall
cmNinjaTargetGenerator::CompileWithDefines(cmNinjaTargetGenerator *this,string *lang)

{
  cmMakefile *this_00;
  bool bVar1;
  string local_90;
  cmAlphaNum local_70;
  cmAlphaNum local_40;
  
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  local_40.View_._M_len = 6;
  local_40.View_._M_str = "CMAKE_";
  local_70.View_._M_str = (lang->_M_dataplus)._M_p;
  local_70.View_._M_len = lang->_M_string_length;
  cmStrCat<char[22]>(&local_90,&local_40,&local_70,(char (*) [22])"_COMPILE_WITH_DEFINES");
  bVar1 = cmMakefile::IsOn(this_00,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  return bVar1;
}

Assistant:

bool cmNinjaTargetGenerator::CompileWithDefines(std::string const& lang) const
{
  return this->Makefile->IsOn(
    cmStrCat("CMAKE_", lang, "_COMPILE_WITH_DEFINES"));
}